

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

atom copy_list(atom list)

{
  anon_union_8_9_1d3277aa_for_value aVar1;
  anon_union_8_9_1d3277aa_for_value aVar2;
  undefined8 uVar3;
  anon_union_8_9_1d3277aa_for_value aVar4;
  bool bVar5;
  atom car_val;
  atom aVar6;
  atom aVar7;
  
  aVar4 = list.value;
  if (list.type == T_NIL) {
    aVar1.number = 0.0;
    uVar3 = 0;
  }
  else {
    aVar6._4_4_ = 0;
    aVar6.type = ((aVar4.pair)->car).type;
    aVar6.value.symbol = (aVar4.fp)->_IO_read_ptr;
    aVar6 = cons(aVar6,(atom)ZEXT816(0));
    aVar1 = aVar6.value;
    bVar5 = ((aVar4.pair)->cdr).type != T_NIL;
    uVar3 = 1;
    aVar2 = aVar1;
    do {
      if (!bVar5) break;
      aVar4 = (anon_union_8_9_1d3277aa_for_value)(aVar4.fp)->_IO_read_base;
      car_val._4_4_ = 0;
      car_val.type = ((aVar4.pair)->car).type;
      car_val.value.symbol = (aVar4.fp)->_IO_read_ptr;
      aVar6 = cons(car_val,(atom)ZEXT816(0));
      ((aVar2.pair)->cdr).type = T_CONS;
      ((anon_union_8_9_1d3277aa_for_value *)((*aVar2.jb)[0].__jmpbuf + 3))->pair =
           (pair *)aVar6.value;
      bVar5 = true;
      aVar2 = aVar6.value;
    } while (((aVar4.pair)->cdr).type == T_CONS);
  }
  aVar7.value.pair = aVar1.pair;
  aVar7._0_8_ = uVar3;
  return aVar7;
}

Assistant:

atom copy_list(atom list)
{
	atom a, p;

	if (no(list))
		return nil;

	a = cons(car(list), nil);
	p = a;
	list = cdr(list);

	while (!no(list)) {
		cdr(p) = cons(car(list), nil);
		p = cdr(p);
		list = cdr(list);
		if (list.type != T_CONS) { /* improper list */
			p = list;
			break;
		}
	}

	return a;
}